

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O1

void XorRegion(QRegionPrivate *sra,QRegionPrivate *srb,QRegionPrivate *dest)

{
  int iVar1;
  int iVar2;
  int iVar3;
  QRect *pQVar4;
  long lVar5;
  long lVar6;
  QRegionPrivate *r;
  QRect *pQVar7;
  long in_FS_OFFSET;
  Representation RVar8;
  Representation RVar9;
  Representation RVar10;
  Representation RVar11;
  Representation RVar12;
  Representation RVar13;
  Representation RVar14;
  Representation RVar15;
  QRegionPrivate local_b8;
  QRegionPrivate local_78;
  long local_38;
  
  r = &local_b8;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.numRects = 0;
  local_78.innerArea = -1;
  local_78.rects.d.d = (Data *)0x0;
  local_78.rects.d.ptr = (QRect *)0x0;
  local_78.rects.d.size = 0;
  local_78.extents.x1.m_i = 0;
  local_78.extents.y1.m_i = 0;
  local_78.extents.x2.m_i = -1;
  local_78.extents.y2.m_i = -1;
  local_78.innerRect.x1.m_i = 0;
  local_78.innerRect.y1.m_i = 0;
  local_78.innerRect.x2.m_i = -1;
  local_78.innerRect.y2.m_i = -1;
  local_b8.numRects = 0;
  local_b8.innerArea = -1;
  local_b8.rects.d.d = (Data *)0x0;
  local_b8.rects.d.ptr = (QRect *)0x0;
  local_b8.rects.d.size = 0;
  local_b8.extents.x1.m_i = 0;
  local_b8.extents.y1.m_i = 0;
  local_b8.extents.x2.m_i = -1;
  local_b8.extents.y2.m_i = -1;
  local_b8.innerRect.x1.m_i = 0;
  local_b8.innerRect.y1.m_i = 0;
  local_b8.innerRect.x2.m_i = -1;
  local_b8.innerRect.y2.m_i = -1;
  if (((((sra->extents).x1.m_i < (srb->innerRect).x1.m_i) ||
       ((srb->innerRect).x2.m_i < (sra->extents).x2.m_i)) ||
      ((sra->extents).y1.m_i < (srb->innerRect).y1.m_i)) ||
     ((srb->innerRect).y2.m_i < (sra->extents).y2.m_i)) {
    miRegionOp(&local_78,sra,srb,miSubtractO,miSubtractNonO1,(NonOverlapFunc)0x0);
    miSetExtents(&local_78);
  }
  if ((((srb->extents).x1.m_i < (sra->innerRect).x1.m_i) ||
      ((sra->innerRect).x2.m_i < (srb->extents).x2.m_i)) ||
     (((srb->extents).y1.m_i < (sra->innerRect).y1.m_i ||
      ((sra->innerRect).y2.m_i < (srb->extents).y2.m_i)))) {
    miRegionOp(&local_b8,srb,sra,miSubtractO,miSubtractNonO1,(NonOverlapFunc)0x0);
    miSetExtents(&local_b8);
  }
  lVar6 = (long)local_78.numRects;
  if (lVar6 == 0) {
    dest->numRects = local_b8.numRects;
    dest->innerArea = local_b8.innerArea;
    QArrayDataPointer<QRect>::operator=(&(dest->rects).d,&local_b8.rects.d);
    RVar8.m_i = local_b8.extents.x1.m_i;
    RVar9.m_i = local_b8.extents.y1.m_i;
    RVar10.m_i = local_b8.extents.x2.m_i;
    RVar11.m_i = local_b8.extents.y2.m_i;
    RVar12.m_i = local_b8.innerRect.x1.m_i;
    RVar13.m_i = local_b8.innerRect.y1.m_i;
    RVar14.m_i = local_b8.innerRect.x2.m_i;
    RVar15.m_i = local_b8.innerRect.y2.m_i;
  }
  else {
    lVar5 = (long)local_b8.numRects;
    if (lVar5 != 0) {
      pQVar7 = local_b8.rects.d.ptr;
      if (local_b8.numRects == 1) {
        pQVar7 = &local_b8.extents;
      }
      pQVar4 = local_b8.rects.d.ptr;
      if (local_b8.numRects == 1) {
        pQVar4 = &local_b8.extents;
      }
      iVar1 = (pQVar4->y1).m_i;
      pQVar4 = local_78.rects.d.ptr + lVar6 + -1;
      if (local_78.numRects == 1) {
        pQVar4 = &local_78.extents;
      }
      iVar2 = (pQVar4->y2).m_i;
      if (iVar2 < iVar1) {
LAB_004352ba:
        dest->numRects = local_78.numRects;
        dest->innerArea = local_78.innerArea;
        QArrayDataPointer<QRect>::operator=(&(dest->rects).d,&local_78.rects.d);
        (dest->extents).x1 = (Representation)local_78.extents.x1.m_i;
        (dest->extents).y1 = (Representation)local_78.extents.y1.m_i;
        (dest->extents).x2 = (Representation)local_78.extents.x2.m_i;
        (dest->extents).y2 = (Representation)local_78.extents.y2.m_i;
        (dest->innerRect).x1 = (Representation)local_78.innerRect.x1.m_i;
        (dest->innerRect).y1 = (Representation)local_78.innerRect.y1.m_i;
        (dest->innerRect).x2 = (Representation)local_78.innerRect.x2.m_i;
        (dest->innerRect).y2 = (Representation)local_78.innerRect.y2.m_i;
      }
      else {
        pQVar4 = local_78.rects.d.ptr + lVar6 + -1;
        if (local_78.numRects == 1) {
          pQVar4 = &local_78.extents;
        }
        iVar3 = (pQVar4->y1).m_i;
        if (iVar1 == iVar3) {
          pQVar4 = local_b8.rects.d.ptr;
          if (local_b8.numRects == 1) {
            pQVar4 = &local_b8.extents;
          }
          if ((pQVar4->y2).m_i - iVar1 == iVar2 - iVar3) {
            pQVar4 = &local_78.extents;
            if (local_78.numRects != 1) {
              pQVar4 = local_78.rects.d.ptr + lVar6 + -1;
            }
            if ((pQVar4->x2).m_i < (pQVar7->x1).m_i) goto LAB_004352ba;
          }
        }
        pQVar7 = &local_78.extents;
        if (local_78.numRects != 1) {
          pQVar7 = local_78.rects.d.ptr;
        }
        pQVar4 = local_78.rects.d.ptr;
        if (local_78.numRects == 1) {
          pQVar4 = &local_78.extents;
        }
        iVar1 = (pQVar4->y1).m_i;
        pQVar4 = local_b8.rects.d.ptr + lVar5 + -1;
        if (local_b8.numRects == 1) {
          pQVar4 = &local_b8.extents;
        }
        iVar2 = (pQVar4->y2).m_i;
        if (iVar1 <= iVar2) {
          pQVar4 = local_b8.rects.d.ptr + lVar5 + -1;
          if (local_b8.numRects == 1) {
            pQVar4 = &local_b8.extents;
          }
          iVar3 = (pQVar4->y1).m_i;
          if (iVar1 == iVar3) {
            pQVar4 = local_78.rects.d.ptr;
            if (local_78.numRects == 1) {
              pQVar4 = &local_78.extents;
            }
            if ((pQVar4->y2).m_i - iVar1 == iVar2 - iVar3) {
              pQVar4 = &local_b8.extents;
              if (local_b8.numRects != 1) {
                pQVar4 = local_b8.rects.d.ptr + lVar5 + -1;
              }
              if ((pQVar4->x2).m_i < (pQVar7->x1).m_i) goto LAB_004353c6;
            }
          }
          UnionRegion(&local_78,&local_b8,dest);
          goto LAB_004353f9;
        }
LAB_004353c6:
        dest->numRects = local_b8.numRects;
        dest->innerArea = local_b8.innerArea;
        QArrayDataPointer<QRect>::operator=(&(dest->rects).d,&local_b8.rects.d);
        (dest->extents).x1 = (Representation)local_b8.extents.x1.m_i;
        (dest->extents).y1 = (Representation)local_b8.extents.y1.m_i;
        (dest->extents).x2 = (Representation)local_b8.extents.x2.m_i;
        (dest->extents).y2 = (Representation)local_b8.extents.y2.m_i;
        (dest->innerRect).x1 = (Representation)local_b8.innerRect.x1.m_i;
        (dest->innerRect).y1 = (Representation)local_b8.innerRect.y1.m_i;
        (dest->innerRect).x2 = (Representation)local_b8.innerRect.x2.m_i;
        (dest->innerRect).y2 = (Representation)local_b8.innerRect.y2.m_i;
        r = &local_78;
      }
      QRegionPrivate::append(dest,r);
      goto LAB_004353f9;
    }
    dest->numRects = local_78.numRects;
    dest->innerArea = local_78.innerArea;
    QArrayDataPointer<QRect>::operator=(&(dest->rects).d,&local_78.rects.d);
    RVar8.m_i = local_78.extents.x1.m_i;
    RVar9.m_i = local_78.extents.y1.m_i;
    RVar10.m_i = local_78.extents.x2.m_i;
    RVar11.m_i = local_78.extents.y2.m_i;
    RVar12.m_i = local_78.innerRect.x1.m_i;
    RVar13.m_i = local_78.innerRect.y1.m_i;
    RVar14.m_i = local_78.innerRect.x2.m_i;
    RVar15.m_i = local_78.innerRect.y2.m_i;
  }
  (dest->extents).x1.m_i = RVar8.m_i;
  (dest->extents).y1.m_i = RVar9.m_i;
  (dest->extents).x2.m_i = RVar10.m_i;
  (dest->extents).y2.m_i = RVar11.m_i;
  (dest->innerRect).x1.m_i = RVar12.m_i;
  (dest->innerRect).y1.m_i = RVar13.m_i;
  (dest->innerRect).x2.m_i = RVar14.m_i;
  (dest->innerRect).y2.m_i = RVar15.m_i;
LAB_004353f9:
  if (&(local_b8.rects.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.rects.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.rects.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.rects.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.rects.d.d)->super_QArrayData,0x10,0x10);
    }
  }
  if (&(local_78.rects.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.rects.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.rects.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.rects.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.rects.d.d)->super_QArrayData,0x10,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void XorRegion(QRegionPrivate *sra, QRegionPrivate *srb, QRegionPrivate &dest)
{
    Q_ASSERT(!isEmptyHelper(sra) && !isEmptyHelper(srb));
    Q_ASSERT(EXTENTCHECK(&sra->extents, &srb->extents));
    Q_ASSERT(!EqualRegion(sra, srb));

    QRegionPrivate tra, trb;

    if (!srb->contains(*sra))
        SubtractRegion(sra, srb, tra);
    if (!sra->contains(*srb))
        SubtractRegion(srb, sra, trb);

    Q_ASSERT(isEmptyHelper(&trb) || !tra.contains(trb));
    Q_ASSERT(isEmptyHelper(&tra) || !trb.contains(tra));

    if (isEmptyHelper(&tra)) {
        dest = trb;
    } else if (isEmptyHelper(&trb)) {
        dest = tra;
    } else if (tra.canAppend(&trb)) {
        dest = tra;
        dest.append(&trb);
    } else if (trb.canAppend(&tra)) {
        dest = trb;
        dest.append(&tra);
    } else {
        UnionRegion(&tra, &trb, dest);
    }
}